

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progressBar.c
# Opt level: O3

void printProgressBar(_Bool *running,int *error,progress_t *p)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  double local_68;
  
  iVar1 = ioctl(1,0x5413,&printProgressBar::ws);
  if (*running == true) {
    uVar3 = 0x3d;
    if (-1 < iVar1) {
      uVar3 = printProgressBar::ws.ws_col - 0x13 & 0xffff;
    }
    local_68 = 0.0;
    bVar2 = 0;
    do {
      if (*error != 0) {
        return;
      }
      if (p->operations <= p->progress) {
        return;
      }
      iVar1 = pthread_mutex_trylock((pthread_mutex_t *)p->progress_mutex);
      if (iVar1 == 0) {
        local_68 = (((double)(p->progress >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                   (double)(p->progress & 0xffffffff | 0x4330000000000000)) /
                   (((double)(p->operations >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25)
                   + (double)(p->operations & 0xffffffff | 0x4330000000000000));
        pthread_mutex_unlock((pthread_mutex_t *)p->progress_mutex);
      }
      else {
        nanosleep((timespec *)&printProgressBar::sleep_interval,(timespec *)0x0);
      }
      printf("%s[");
      if (uVar3 != 0) {
        uVar4 = 0;
        do {
          iVar1 = 0x23;
          if (((int)(local_68 * (double)uVar3) <= (int)uVar4) &&
             (iVar1 = 0x20, uVar4 == (int)(local_68 * (double)uVar3))) {
            iVar1 = (&DAT_00112890)[bVar2];
          }
          putchar(iVar1);
          uVar4 = uVar4 + 1;
        } while (uVar3 != uVar4);
      }
      printf("]%.2f%%\r",local_68 * 100.0);
      fflush(_stdout);
      bVar2 = bVar2 + 1 & 3;
    } while (*running != false);
  }
  return;
}

Assistant:

void printProgressBar(bool* running, int* error, progress_t* p)
{
    const char* action = p->encrypt ? "Encrypting" : "Decrypting";
    uint8_t count = 0;
    static struct winsize ws;
    const size_t term_width = ioctl(1, TIOCGWINSZ, &ws) >= 0 ? ws.ws_col : STD_TERM_WIDTH;
    const uint16_t bar_size = term_width - SUBTRACT_SIZE;
    double ratio = 0.0;
    const static struct timespec sleep_interval = { .tv_sec = 0, .tv_nsec = 50000000 }; //interval for nanosleep

    while(*(running) && *(error) == 0 && p->progress < p->operations)
    {
	    if(pthread_mutex_trylock(p->progress_mutex) == 0)
        {
            ratio = ((double)p->progress/(double)p->operations);
            //sleep the progress bar so the program can do some work
            //TODO figure out what header nanosleep is declared in if not <time.h>
	        pthread_mutex_unlock(p->progress_mutex);
        }
        else { nanosleep(&sleep_interval, (struct timespec *)NULL); }

    	printf("%s[", action);

        int bar = ratio * bar_size;
	    for(int i=0; i<bar_size; ++i)
	    { 
	        if(i<bar) { printf("#"); } //use # as the solid part of the progress bar
	        else if(i == bar)
            {
	            //spin the cursor so that the user feels like something is happening
	            if(count == 0) printf("|");
	            else if(count == 1) printf("/");
	            else if(count == 2) printf("-");
	            else if(count == 3) printf("\\");
	        }
	        else { printf(" "); }
        }
        printf("]%.2f%%\r", ratio*100);
        fflush(stdout);
	    count = (count+1)%4;
    }
}